

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

int compare_files(char *fn,char *fn2)

{
  int iVar1;
  uint __fd;
  uint __fd_00;
  size_t sVar2;
  ulong __n;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  size_t b;
  stat sb2;
  stat sb1;
  uint8_t buf2 [512];
  uint8_t buf1 [512];
  stat local_558;
  stat local_4c8;
  char local_438 [512];
  char local_238 [520];
  
  iVar1 = stat(fn,&local_4c8);
  if ((iVar1 == 0) && (iVar1 = stat(fn2,&local_558), iVar1 == 0)) {
    if (local_4c8.st_size == local_558.st_size) {
      iVar1 = 0;
      __fd = open(fn,0);
      __fd_00 = open(fn2,0);
      lVar5 = local_4c8.st_size;
      if (-1 < (int)(__fd_00 | __fd)) {
        for (; lVar5 != 0; lVar5 = lVar5 - __n) {
          __n = read(__fd,local_238,0x200);
          uVar3 = read(__fd_00,local_438,0x200);
          if ((long)(uVar3 | __n) < 0) {
            pcVar6 = "Unable to read from files ";
            lVar5 = 0x1a;
LAB_0011079a:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
            poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = std::ostream::_M_insert<long>((long)poVar4);
            goto LAB_001107cf;
          }
          if (__n != uVar3) {
            pcVar6 = "Mismatch in read amounts ";
            lVar5 = 0x19;
            goto LAB_0011079a;
          }
          if ((0 < (long)__n) && (iVar1 = bcmp(local_238,local_438,__n), iVar1 != 0)) {
            uVar3 = 0;
            goto LAB_00110818;
          }
        }
        iVar1 = 0;
      }
LAB_001107fe:
      close(__fd);
      close(__fd_00);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"File sizes do not match: \'",0x1a);
      if (fn == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x198870);
      }
      else {
        sVar2 = strlen(fn);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,fn,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\' ",2);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," \'",2);
      if (fn2 == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar2 = strlen(fn2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,fn2,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' ",2);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar1 = 1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to stat \'",0x10);
    if (fn == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x198870);
    }
    else {
      sVar2 = strlen(fn);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,fn,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\' and \'",7);
    if (fn2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x198870);
    }
    else {
      sVar2 = strlen(fn2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,fn2,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
LAB_00110818:
  if (local_238[uVar3] == local_438[uVar3]) goto code_r0x0011082a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Files \'",7);
  if (fn == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x198870);
  }
  else {
    sVar2 = strlen(fn);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,fn,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\' and \'",7);
  if (fn2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x198870);
  }
  else {
    sVar2 = strlen(fn2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,fn2,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\' differ in chunk starting at ",0x1e);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
LAB_001107cf:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
LAB_001107f9:
  iVar1 = -1;
  goto LAB_001107fe;
code_r0x0011082a:
  uVar3 = uVar3 + 1;
  if (__n == uVar3) goto LAB_001107f9;
  goto LAB_00110818;
}

Assistant:

static int compare_files (const char *fn, const char *fn2)
{
    struct stat sb1, sb2;
    if ( 0 == stat (fn, &sb1) && 0 == stat (fn2, &sb2))
    {
        if (sb1.st_size != sb2.st_size)
        {
            std::cerr << "File sizes do not match: '" << fn << "' " << sb1.st_size << " '" << fn2 << "' " << sb2.st_size << std::endl;
            return 1;
        }
        int fd1, fd2;
        int ret = 0;
        fd1 = open (fn, O_RDONLY);
        fd2 = open (fn2, O_RDONLY);
        if (fd1 >= 0 && fd2 >= 0)
        {
            uint8_t buf1[512], buf2[512];
            size_t toRead = sb1.st_size;
            size_t chunkReq = sizeof(buf1);
            size_t offset = 0;
            while (toRead > 0)
            {
                ssize_t nr1 = read (fd1, buf1, chunkReq);
                ssize_t nr2 = read (fd2, buf2, chunkReq);
                if (nr1 < 0 || nr2 < 0)
                {
                    std::cerr << "Unable to read from files " << nr1 << ", " << nr2 << std::endl;
                    ret = -1;
                    break;
                }
                if (nr1 != nr2)
                {
                    std::cerr << "Mismatch in read amounts " << nr1 << ", " << nr2 << std::endl;
                    ret = -1;
                    break;
                }
                if (nr1 > 0)
                {
                    if (memcmp (buf1, buf2, nr1) != 0)
                    {
                        for ( size_t b = 0; b < nr1; ++b )
                        {
                            if (buf1[b] != buf2[b])
                            {
                                std::cerr << "Files '" << fn << "' and '" << fn2 << "' differ in chunk starting at " << offset + b << std::endl;
                                break;
                            }
                        }
                        ret = -1;
                        break;
                    }
                }
                offset += nr1;
                toRead -= nr1;
            }
        }
        close (fd1);
        close (fd2);
        return ret;
    }
    else
    {
        std::cerr << "Unable to stat '" << fn << "' and '" << fn2 << "'" << std::endl;
    }
    return -1;
}